

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint32 __thiscall crnd::symbol_codec::decode(symbol_codec *this,static_huffman_data_model *model)

{
  decoder_tables *pdVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  bit_buf_type bVar10;
  
  pdVar1 = model->m_pDecode_tables;
  iVar8 = this->m_bit_count;
  if (iVar8 < 0x18) {
    pbVar4 = this->m_pDecode_buf_next;
    pbVar2 = this->m_pDecode_buf_end;
    uVar9 = 0;
    if (iVar8 < 0x10) {
      if (pbVar4 < pbVar2) {
        bVar5 = *pbVar4;
        pbVar4 = pbVar4 + 1;
        uVar6 = (uint)bVar5 << 8;
      }
      else {
        uVar6 = 0;
      }
      if (pbVar4 < pbVar2) {
        uVar9 = (uint)*pbVar4;
        pbVar4 = pbVar4 + 1;
      }
      uVar9 = uVar9 | uVar6;
      this->m_pDecode_buf_next = pbVar4;
      bVar5 = 0x10 - (char)iVar8;
      iVar8 = iVar8 + 0x10;
    }
    else {
      if (pbVar4 < pbVar2) {
        this->m_pDecode_buf_next = pbVar4 + 1;
        uVar9 = (uint)*pbVar4;
      }
      bVar5 = 0x18 - (char)iVar8;
      iVar8 = iVar8 + 8;
    }
    this->m_bit_count = iVar8;
    bVar10 = uVar9 << (bVar5 & 0x1f) | this->m_bit_buf;
    this->m_bit_buf = bVar10;
  }
  else {
    bVar10 = this->m_bit_buf;
  }
  if (bVar10 >> 0x10 < pdVar1->m_table_max_code) {
    uVar9 = pdVar1->m_lookup[bVar10 >> (-(char)pdVar1->m_table_bits & 0x1fU)] & 0xffff;
    uVar6 = pdVar1->m_lookup[bVar10 >> (-(char)pdVar1->m_table_bits & 0x1fU)] >> 0x10;
  }
  else {
    iVar3 = pdVar1->m_decode_start_code_size - 0x21;
    do {
      iVar7 = iVar3;
      iVar3 = iVar7 + 1;
    } while (pdVar1->m_max_codes[iVar7 + 0x20U] <= bVar10 >> 0x10);
    uVar9 = (bVar10 >> (-(char)(iVar7 + 1) & 0x1fU)) + pdVar1->m_val_ptrs[iVar7 + 0x20U];
    if (model->m_total_syms <= uVar9) {
      return 0;
    }
    uVar6 = iVar7 + 0x21;
    uVar9 = (uint)pdVar1->m_sorted_symbol_order[(int)uVar9];
  }
  this->m_bit_buf = bVar10 << ((byte)uVar6 & 0x1f);
  this->m_bit_count = iVar8 - uVar6;
  return uVar9;
}

Assistant:

uint32 symbol_codec::decode(const static_huffman_data_model& model)
    {
        const prefix_coding::decoder_tables* pTables = model.m_pDecode_tables;

        if (m_bit_count < 24)
        {
            if (m_bit_count < 16)
            {
                uint32 c0 = 0, c1 = 0;
                const uint8* p = m_pDecode_buf_next;
                if (p < m_pDecode_buf_end)
                    c0 = *p++;
                if (p < m_pDecode_buf_end)
                    c1 = *p++;
                m_pDecode_buf_next = p;
                m_bit_count += 16;
                uint32 c = (c0 << 8) | c1;
                m_bit_buf |= (c << (32 - m_bit_count));
            }
            else
            {
                uint32 c = (m_pDecode_buf_next < m_pDecode_buf_end) ? *m_pDecode_buf_next++ : 0;
                m_bit_count += 8;
                m_bit_buf |= (c << (32 - m_bit_count));
            }
        }

        uint32 k = (m_bit_buf >> 16) + 1;
        uint32 sym, len;

        if (k <= pTables->m_table_max_code)
        {
            uint32 t = pTables->m_lookup[m_bit_buf >> (32 - pTables->m_table_bits)];

            CRND_ASSERT(t != cUINT32_MAX);
            sym = t & cUINT16_MAX;
            len = t >> 16;

            CRND_ASSERT(model.m_code_sizes[sym] == len);
        }
        else
        {
            len = pTables->m_decode_start_code_size;

            for (;;)
            {
                if (k <= pTables->m_max_codes[len - 1])
                    break;
                len++;
            }

            int val_ptr = pTables->m_val_ptrs[len - 1] + (m_bit_buf >> (32 - len));

            if (((uint32)val_ptr >= model.m_total_syms))
            {
                // corrupted stream, or a bug
                CRND_ASSERT(0);
                return 0;
            }

            sym = pTables->m_sorted_symbol_order[val_ptr];
        }

        m_bit_buf <<= len;
        m_bit_count -= len;

        return sym;
    }